

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  bool bVar1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *this_00;
  reference ppcVar2;
  reference ppcVar3;
  pointer ppVar4;
  _Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_> local_a8;
  cmTarget *local_a0;
  cmTarget *t;
  iterator __end1;
  iterator __begin1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range1;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> local_58;
  cmLocalGenerator *local_50;
  cmTarget *target;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__range2;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  *importedMap_local;
  cmLocalGenerator *lg_local;
  cmMakefile *mf_local;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  if (targetTypes == AllTargets) {
    this_00 = cmMakefile::GetOrderedTargets(mf);
    __end2 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin(this_00);
    target = (cmTarget *)std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                       *)&target), bVar1) {
      ppcVar2 = __gnu_cxx::
                __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                ::operator*(&__end2);
      local_50 = (cmLocalGenerator *)*ppcVar2;
      std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
                ((cmTarget **)&local_58,&local_50);
      cmLocalGenerator::AddGeneratorTarget(lg,&local_58);
      std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                (&local_58);
      __gnu_cxx::
      __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
      operator++(&__end2);
    }
  }
  cmMakefile::GetImportedTargets((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1,mf);
  __end1 = std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                     ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  t = (cmTarget *)
      std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                     *)&t), bVar1) {
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
              ::operator*(&__end1);
    local_a0 = *ppcVar3;
    local_a8._M_node =
         (_Base_ptr)
         std::
         map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         ::find(importedMap,&local_a0);
    ppVar4 = std::_Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_a8);
    cmLocalGenerator::AddImportedGeneratorTarget(lg,ppVar4->second);
    __gnu_cxx::__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&__begin1);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
  TargetTypes targetTypes, cmMakefile* mf, cmLocalGenerator* lg,
  std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets) {
    for (cmTarget* target : mf->GetOrderedTargets()) {
      lg->AddGeneratorTarget(cm::make_unique<cmGeneratorTarget>(target, lg));
    }
  }

  for (cmTarget* t : mf->GetImportedTargets()) {
    lg->AddImportedGeneratorTarget(importedMap.find(t)->second);
  }
}